

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O1

void __thiscall EPoller::removeChannel(EPoller *this,ChannelPtr *channel)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  Logger local_1010;
  undefined1 local_38 [8];
  epoll_event event;
  int fd;
  
  event.data.fd = ((channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->fd_;
  uVar1 = (this->channels_)._M_h._M_bucket_count;
  uVar5 = (ulong)(long)event.data.fd % uVar1;
  p_Var6 = (this->channels_)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, event.data.fd != *(int *)&p_Var6->_M_nxt[1]._M_nxt))
  {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, event.data.fd == *(int *)&p_Var2[1]._M_nxt)) goto LAB_0011c959;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_0011c959:
  if ((p_Var7 != (__node_base_ptr)0x0) && (p_Var7->_M_nxt != (_Hash_node_base *)0x0)) {
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->channels_,&event.data.fd);
    if ((pmVar4->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
      __assert_fail("channels_[fd] == channel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                    ,0x54,"void EPoller::removeChannel(ChannelPtr)");
    }
    std::
    _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->channels_)._M_h,&event.data);
    event.events = 0;
    local_38._4_4_ = event.data.fd;
    local_38._0_4_ =
         ((channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->events_;
    iVar3 = epoll_ctl(this->epollfd_,2,event.data.fd,(epoll_event *)local_38);
    if (iVar3 < 0) {
      Logger::Logger(&local_1010,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                     ,0x5c);
      if (0x16 < ((int)&local_1010 + 0xfa8) - (int)local_1010.impl_.stream_.buffer_.cur_) {
        builtin_strncpy(local_1010.impl_.stream_.buffer_.cur_,"Error: epoll_del error",0x16);
        local_1010.impl_.stream_.buffer_.cur_ = local_1010.impl_.stream_.buffer_.cur_ + 0x16;
      }
      Logger::~Logger(&local_1010);
    }
    return;
  }
  __assert_fail("channels_.find(fd) != channels_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                ,0x53,"void EPoller::removeChannel(ChannelPtr)");
}

Assistant:

void EPoller::removeChannel(ChannelPtr channel) {
    int fd = channel->fd();
    assert(channels_.find(fd) != channels_.end());
    assert(channels_[fd] == channel);

    channels_.erase(fd);
    struct epoll_event event;
    memset(&event, 0, sizeof event);
    event.events = channel->events();
    event.data.fd = fd;
    if (epoll_ctl(epollfd_, EPOLL_CTL_DEL, fd, &event) < 0) {
        LOG << "Error: epoll_del error";
    } 
    // LOG << "Epoll DEL fd = " << fd;
}